

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

void cf_thread_set_priority(cf_thread_t t,cf_thread_priority_t p)

{
  return;
}

Assistant:

void cf_thread_set_priority(cf_thread_t t, cf_thread_priority_t p) {
#ifdef CF_OS_WIN
    int priority = THREAD_PRIORITY_NORMAL;
    if (p == CF_THREAD_PRIORITY_LOW) {
        priority = THREAD_PRIORITY_LOWEST;
    } else if (p == CF_THREAD_PRIORITY_HIGH) {
        priority = THREAD_PRIORITY_HIGHEST;
    }
    SetThreadPriority(t, priority);
#else
#endif
}